

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O2

int Io_WriteMoPla(Abc_Ntk_t *pNtk,char *pFileName)

{
  char *pcVar1;
  FILE *__stream;
  char *pcVar2;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWritePla.c"
                  ,0x1ae,"int Io_WriteMoPla(Abc_Ntk_t *, char *)");
  }
  if (pNtk->vCis->nSize < 0x11) {
    __stream = fopen(pFileName,"w");
    if (__stream != (FILE *)0x0) {
      pcVar1 = pNtk->pName;
      pcVar2 = Extra_TimeStamp();
      fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar1,pcVar2);
      Io_WriteMoPlaOne((FILE *)__stream,pNtk);
      fclose(__stream);
      return 1;
    }
    fwrite("Io_WritePla(): Cannot open the output file.\n",0x2c,1,_stdout);
  }
  else {
    puts("Cannot write multi-output PLA for more than 16 inputs.");
  }
  return 0;
}

Assistant:

int Io_WriteMoPla( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    assert( Abc_NtkIsStrash(pNtk) );
    if ( Abc_NtkCiNum(pNtk) > 16 )
    {
        printf( "Cannot write multi-output PLA for more than 16 inputs.\n" );
        return 0;
    }    
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WritePla(): Cannot open the output file.\n" );
        return 0;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    Io_WriteMoPlaOne( pFile, pNtk );
    fclose( pFile );
    return 1;
}